

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu382_com.c
# Opt level: O0

void vdpu382_setup_statistic(Vdpu382RegCommon *com,Vdpu382RegStatistic *sta)

{
  Vdpu382RegStatistic *sta_local;
  Vdpu382RegCommon *com_local;
  
  com->reg011 = (SWREG11_IMPORTANT_EN_conflict)((uint)com->reg011 & 0xfeffffff | 0x1000000);
  memset(sta,0,0x58);
  sta->reg256 = (SWREG256_DEBUG_PERF_LATENCY_CTRL0)((uint)sta->reg256 & 0xfffffffe | 1);
  sta->reg256 = (SWREG256_DEBUG_PERF_LATENCY_CTRL0)((uint)sta->reg256 & 0xfffffffd | 2);
  sta->reg256 = (SWREG256_DEBUG_PERF_LATENCY_CTRL0)((uint)sta->reg256 & 0xfffffff7 | 8);
  sta->reg257 = (SWREG257_DEBUG_PERF_LATENCY_CTRL1)((uint)sta->reg257 & 0xfffffffc | 1);
  sta->reg270 = (SWREG270_DEBUG_QOS_CTRL_conflict)((uint)sta->reg270 & 0xf8ffffff | 0x3000000);
  sta->reg270 = (SWREG270_DEBUG_QOS_CTRL_conflict)((uint)sta->reg270 & 0xfff8ffff | 0x10000);
  sta->reg270 = (SWREG270_DEBUG_QOS_CTRL_conflict)((uint)sta->reg270 & 0xff8fffff | 0x100000);
  sta->reg270 = (SWREG270_DEBUG_QOS_CTRL_conflict)((uint)sta->reg270 & 0x8fffffff | 0x30000000);
  sta->reg270 = (SWREG270_DEBUG_QOS_CTRL_conflict)((uint)sta->reg270 & 0xffffff00 | 0xff);
  sta->reg271_wr_wait_cycle_qos = 0;
  return;
}

Assistant:

void vdpu382_setup_statistic(Vdpu382RegCommon *com, Vdpu382RegStatistic *sta)
{
    com->reg011.pix_range_detection_e = 1;

    memset(sta, 0, sizeof(*sta));

    sta->reg256.axi_perf_work_e = 1;
    sta->reg256.axi_perf_clr_e = 1;
    sta->reg256.axi_cnt_type = 1;

    sta->reg257.addr_align_type = 1;

    /* set hurry */
    sta->reg270.axi_rd_hurry_level = 3;
    sta->reg270.axi_wr_hurry_level = 1;
    sta->reg270.axi_wr_qos = 1;
    sta->reg270.axi_rd_qos = 3;
    sta->reg270.bus2mc_buffer_qos_level = 255;
    sta->reg271_wr_wait_cycle_qos = 0;
}